

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.h
# Opt level: O2

void __thiscall stk::StkError::~StkError(StkError *this)

{
  this->_vptr_StkError = (_func_int **)&PTR__StkError_00115c78;
  std::__cxx11::string::~string((string *)&this->message_);
  return;
}

Assistant:

virtual ~StkError(void) {}